

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obudec.c
# Opt level: O0

int obudec_grow_buffer(size_t growth_amount,uint8_t **obu_buffer,size_t *obu_buffer_capacity)

{
  ulong __size;
  void *pvVar1;
  ulong *in_RDX;
  long *in_RSI;
  long in_RDI;
  uint8_t *new_buffer;
  size_t new_capacity;
  size_t capacity;
  int local_4;
  
  if (((*in_RSI == 0) || (in_RDX == (ulong *)0x0)) || (in_RDI == 0)) {
    local_4 = -1;
  }
  else if (-in_RDI - 1U < *in_RDX) {
    fprintf(_stderr,"obudec: cannot grow buffer, capacity will roll over.\n");
    local_4 = -1;
  }
  else {
    __size = *in_RDX + in_RDI;
    if (__size < 0x200000001) {
      pvVar1 = realloc((void *)*in_RSI,__size);
      if (pvVar1 == (void *)0x0) {
        fprintf(_stderr,"obudec: Failed to allocate compressed data buffer.\n");
        local_4 = -1;
      }
      else {
        *in_RSI = (long)pvVar1;
        *in_RDX = __size;
        local_4 = 0;
      }
    }
    else {
      fprintf(_stderr,"obudec: OBU size exceeds max alloc size.\n");
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

static int obudec_grow_buffer(size_t growth_amount, uint8_t **obu_buffer,
                              size_t *obu_buffer_capacity) {
  if (!*obu_buffer || !obu_buffer_capacity || growth_amount == 0) {
    return -1;
  }

  const size_t capacity = *obu_buffer_capacity;
  if (SIZE_MAX - growth_amount < capacity) {
    fprintf(stderr, "obudec: cannot grow buffer, capacity will roll over.\n");
    return -1;
  }

  const size_t new_capacity = capacity + growth_amount;

#if defined AOM_MAX_ALLOCABLE_MEMORY
  if (new_capacity > AOM_MAX_ALLOCABLE_MEMORY) {
    fprintf(stderr, "obudec: OBU size exceeds max alloc size.\n");
    return -1;
  }
#endif

  uint8_t *new_buffer = (uint8_t *)realloc(*obu_buffer, new_capacity);
  if (!new_buffer) {
    fprintf(stderr, "obudec: Failed to allocate compressed data buffer.\n");
    return -1;
  }

  *obu_buffer = new_buffer;
  *obu_buffer_capacity = new_capacity;
  return 0;
}